

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

int SimpleString::MemCmp(void *s1,void *s2,size_t n)

{
  uchar *p2;
  uchar *p1;
  size_t n_local;
  void *s2_local;
  void *s1_local;
  
  p2 = (uchar *)s2;
  p1 = (uchar *)s1;
  n_local = n;
  while( true ) {
    if (n_local == 0) {
      return 0;
    }
    if (*p1 != *p2) break;
    p1 = p1 + 1;
    p2 = p2 + 1;
    n_local = n_local - 1;
  }
  return (uint)*p1 - (uint)*p2;
}

Assistant:

int SimpleString::MemCmp(const void* s1, const void *s2, size_t n)
{
    const unsigned char* p1 = (const unsigned char*) s1;
    const unsigned char* p2 = (const unsigned char*) s2;

    while (n--)
        if (*p1 != *p2) {
            return *p1 - *p2;
        } else {
            ++p1;
            ++p2;
        }
    return 0;
}